

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O2

void __thiscall
jaegertracing::propagation::BinaryPropagator::inject
          (BinaryPropagator *this,SpanContext *ctx,ostream *out)

{
  __node_base *p_Var1;
  
  writeBinary<unsigned_long>(out,(ctx->_traceID)._high);
  writeBinary<unsigned_long>(out,(ctx->_traceID)._low);
  writeBinary<unsigned_long>(out,ctx->_spanID);
  writeBinary<unsigned_long>(out,ctx->_parentID);
  std::ostream::put((char)out);
  writeBinary<unsigned_int>(out,(uint)(ctx->_baggage)._M_h._M_element_count);
  p_Var1 = &(ctx->_baggage)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    writeBinary<unsigned_int>(out,(uint)((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
    std::ostream::write((char *)out,(long)p_Var1[1]._M_nxt);
    writeBinary<unsigned_int>(out,*(uint *)&p_Var1[6]._M_nxt);
    std::ostream::write((char *)out,(long)p_Var1[5]._M_nxt);
  }
  return;
}

Assistant:

void inject(const SpanContext& ctx, std::ostream& out) const override
    {
        writeBinary(out, ctx.traceID().high());
        writeBinary(out, ctx.traceID().low());
        writeBinary(out, ctx.spanID());
        writeBinary(out, ctx.parentID());
        // `flags` is a single byte, so endianness is not an issue.
        out.put(ctx.flags());

        writeBinary(out, static_cast<uint32_t>(ctx.baggage().size()));
        for (auto&& pair : ctx.baggage()) {
            auto&& key = pair.first;
            writeBinary(out, static_cast<uint32_t>(key.size()));
            out.write(key.c_str(), key.size());

            auto&& value = pair.second;
            writeBinary(out, static_cast<uint32_t>(value.size()));
            out.write(value.c_str(), value.size());
        }
    }